

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O3

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_That_Test::Body
          (iu_SyntaxTest_x_iutest_x_That_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  AssertionResult *in_R8;
  int x;
  AssertionResult iutest_ar;
  iu_global_format_stringstream strm;
  int local_3c4;
  AssertionResult local_3c0;
  detail *local_398;
  long local_388 [2];
  string local_378;
  AssertionHelper local_358;
  undefined1 local_328 [16];
  undefined1 local_318 [112];
  ios_base local_2a8 [264];
  undefined1 local_1a0 [392];
  
  local_3c4 = 1;
  local_1a0._0_4_ = 1;
  local_328._0_8_ = &PTR__IMatcher_003a9d48;
  local_328._8_8_ = local_1a0;
  iutest::detail::EqMatcher<int>::operator()(&local_3c0,(EqMatcher<int> *)local_328,&local_3c4);
  if (local_3c0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    local_328._0_4_ = local_3c4;
    iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a0,(int *)local_328);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_328);
    std::ostream::operator<<(local_318,local_3c4);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_328);
    std::ios_base::~ios_base(local_2a8);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_378,local_398,"::iutest::Eq(1)",(char *)&local_3c0,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_358,local_378._M_dataplus._M_p,(allocator<char> *)local_328);
    local_358.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
    ;
    local_358.m_part_result.super_iuCodeMessage.m_line = 0x273;
    local_358.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_358,(Fixed *)local_1a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_358.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_358.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_358.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    if (local_398 != (detail *)local_388) {
      operator_delete(local_398,local_388[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0.m_message._M_dataplus._M_p == &local_3c0.m_message.field_2) {
      return;
    }
  }
  else {
    paVar1 = &local_3c0.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_3c0.m_message._M_dataplus._M_p,
                      local_3c0.m_message.field_2._M_allocated_capacity + 1);
    }
    local_3c4 = 1;
    local_1a0._0_4_ = 1;
    local_328._0_8_ = &PTR__IMatcher_003a9d88;
    local_328._8_8_ = local_1a0;
    iutest::detail::LeMatcher<int>::operator()(&local_3c0,(LeMatcher<int> *)local_328,&local_3c4);
    if (local_3c0.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      local_328._0_4_ = local_3c4;
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a0,(int *)local_328);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_328);
      std::ostream::operator<<(local_318,local_3c4);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)local_328);
      std::ios_base::~ios_base(local_2a8);
      iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
                (&local_378,local_398,"::iutest::Le(1)",(char *)&local_3c0,in_R8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_358,local_378._M_dataplus._M_p,(allocator<char> *)local_328);
      local_358.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
      ;
      local_358.m_part_result.super_iuCodeMessage.m_line = 0x275;
      local_358.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_358,(Fixed *)local_1a0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_358.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_358.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_358.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
      }
      if (local_398 != (detail *)local_388) {
        operator_delete(local_398,local_388[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_3c0.m_message._M_dataplus._M_p,
                      local_3c0.m_message.field_2._M_allocated_capacity + 1);
    }
    local_3c4 = 1;
    local_1a0._0_4_ = 1;
    local_328._0_8_ = &PTR__IMatcher_003a9dc8;
    local_328._8_8_ = local_1a0;
    iutest::detail::GeMatcher<int>::operator()(&local_3c0,(GeMatcher<int> *)local_328,&local_3c4);
    if (local_3c0.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      local_328._0_4_ = local_3c4;
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a0,(int *)local_328);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_328);
      std::ostream::operator<<(local_318,local_3c4);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)local_328);
      std::ios_base::~ios_base(local_2a8);
      iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
                (&local_378,local_398,"::iutest::Ge(1)",(char *)&local_3c0,in_R8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_358,local_378._M_dataplus._M_p,(allocator<char> *)local_328);
      local_358.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
      ;
      local_358.m_part_result.super_iuCodeMessage.m_line = 0x277;
      local_358.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
      iutest::AssertionHelper::OnFixed(&local_358,(Fixed *)local_1a0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_358.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_358.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_358.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
      }
      if (local_398 != (detail *)local_388) {
        operator_delete(local_398,local_388[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_3c0.m_message._M_dataplus._M_p,
                      local_3c0.m_message.field_2._M_allocated_capacity + 1);
    }
    local_3c4 = 1;
    local_1a0._0_4_ = 0;
    local_328._0_8_ = &PTR__IMatcher_003a9e08;
    local_328._8_8_ = local_1a0;
    iutest::detail::NeMatcher<int>::operator()(&local_3c0,(NeMatcher<int> *)local_328,&local_3c4);
    if (local_3c0.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      local_328._0_4_ = local_3c4;
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a0,(int *)local_328);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_328);
      std::ostream::operator<<(local_318,local_3c4);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)local_328);
      std::ios_base::~ios_base(local_2a8);
      iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
                (&local_378,local_398,"::iutest::Ne(0)",(char *)&local_3c0,in_R8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_358,local_378._M_dataplus._M_p,(allocator<char> *)local_328);
      local_358.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
      ;
      local_358.m_part_result.super_iuCodeMessage.m_line = 0x279;
      local_358.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffd;
      iutest::AssertionHelper::OnFixed(&local_358,(Fixed *)local_1a0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_358.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_358.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_358.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
      }
      if (local_398 != (detail *)local_388) {
        operator_delete(local_398,local_388[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0.m_message._M_dataplus._M_p == paVar1) {
      return;
    }
  }
  operator_delete(local_3c0.m_message._M_dataplus._M_p,
                  local_3c0.m_message.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

IUTEST(SyntaxTest, That)
{
    if( int x=1 )
        IUTEST_ASSERT_THAT(x, ::iutest::Eq(1)) << x;
    if( int x=1 )
        IUTEST_EXPECT_THAT(x, ::iutest::Le(1)) << x;
    if( int x=1 )
        IUTEST_INFORM_THAT(x, ::iutest::Ge(1)) << x;
    if( int x=1 )
        IUTEST_ASSUME_THAT(x, ::iutest::Ne(0)) << x;
}